

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# scene_instance.h
# Opt level: O3

PrimInfoMB * __thiscall
embree::avx::InstanceISA::createPrimRefMBArray
          (PrimInfoMB *__return_storage_ptr__,InstanceISA *this,mvector<PrimRefMB> *prims,
          BBox1f *t0t1,range<unsigned_long> *r,size_t k,uint geomID)

{
  float geom_time_segments;
  undefined8 uVar1;
  BBox1f BVar2;
  long lVar3;
  PrimRefMB *pPVar4;
  anon_struct_16_4_dc41325d_for_anon_union_16_2_47237d3f_for_Vec3fx_0_1 aVar5;
  anon_struct_16_4_dc41325d_for_anon_union_16_2_47237d3f_for_Vec3fx_0_1 aVar6;
  anon_struct_16_4_dc41325d_for_anon_union_16_2_47237d3f_for_Vec3fx_0_1 aVar7;
  anon_struct_16_4_dc41325d_for_anon_union_16_2_47237d3f_for_Vec3fx_0_1 aVar8;
  float fVar9;
  uint uVar10;
  unsigned_long uVar11;
  AffineSpace3ff *pAVar12;
  undefined4 uVar13;
  ulong uVar14;
  undefined1 auVar15 [16];
  undefined1 auVar16 [16];
  float fVar17;
  undefined1 auVar18 [16];
  undefined1 auVar19 [16];
  float fVar20;
  float fVar23;
  float fVar24;
  float fVar25;
  undefined1 auVar21 [16];
  undefined1 auVar22 [16];
  undefined1 auVar26 [16];
  anon_union_16_2_47237d3f_for_Vec3fa_0 aVar27;
  undefined1 auVar28 [16];
  float fVar29;
  float fVar32;
  float fVar33;
  anon_union_16_2_47237d3f_for_Vec3fa_0 aVar30;
  undefined1 auVar31 [16];
  float fVar34;
  float fVar35;
  float fVar36;
  float fVar39;
  float fVar41;
  float fVar43;
  undefined1 auVar37 [16];
  float fVar40;
  float fVar42;
  float fVar44;
  undefined1 auVar38 [16];
  undefined1 auVar45 [16];
  undefined1 auVar46 [16];
  undefined1 auVar47 [16];
  undefined1 auVar48 [16];
  undefined1 auVar49 [16];
  float fVar50;
  float fVar51;
  float fVar52;
  float fVar53;
  float fVar54;
  float fVar56;
  float fVar57;
  undefined1 auVar55 [16];
  float fVar58;
  float fVar59;
  float fVar62;
  float fVar63;
  float fVar64;
  undefined1 auVar60 [16];
  undefined1 auVar61 [16];
  float fVar65;
  float fVar66;
  float fVar67;
  float fVar68;
  LBBox3fa lbbox;
  float local_c8;
  float fStack_c4;
  float fStack_c0;
  float fStack_bc;
  float local_a8;
  float fStack_a4;
  float fStack_a0;
  float fStack_9c;
  float local_98;
  float fStack_94;
  float fStack_90;
  float fStack_8c;
  float local_88;
  float fStack_84;
  float fStack_80;
  float fStack_7c;
  anon_union_16_2_47237d3f_for_Vec3fa_0 local_78;
  undefined1 local_68 [16];
  undefined1 local_58 [16];
  undefined1 local_48 [16];
  
  aVar30.m128[2] = INFINITY;
  aVar30._0_8_ = 0x7f8000007f800000;
  aVar30.m128[3] = INFINITY;
  (__return_storage_ptr__->super_CentGeom<embree::LBBox<embree::Vec3fa>_>).geomBounds.bounds0.lower.
  field_0 = aVar30;
  aVar27.m128[2] = -INFINITY;
  aVar27._0_8_ = 0xff800000ff800000;
  aVar27.m128[3] = -INFINITY;
  (__return_storage_ptr__->super_CentGeom<embree::LBBox<embree::Vec3fa>_>).geomBounds.bounds0.upper.
  field_0 = aVar27;
  (__return_storage_ptr__->super_CentGeom<embree::LBBox<embree::Vec3fa>_>).geomBounds.bounds1.lower.
  field_0 = aVar30;
  (__return_storage_ptr__->super_CentGeom<embree::LBBox<embree::Vec3fa>_>).geomBounds.bounds1.upper.
  field_0 = aVar27;
  (__return_storage_ptr__->super_CentGeom<embree::LBBox<embree::Vec3fa>_>).centBounds.lower.field_0
       = aVar30;
  (__return_storage_ptr__->super_CentGeom<embree::LBBox<embree::Vec3fa>_>).centBounds.upper.field_0
       = aVar27;
  (__return_storage_ptr__->object_range)._begin = 0;
  (__return_storage_ptr__->object_range)._end = 0;
  __return_storage_ptr__->num_time_segments = 0;
  __return_storage_ptr__->max_num_time_segments = 0;
  (__return_storage_ptr__->max_time_range).lower = 0.0;
  auVar15._8_4_ = 0x3f800000;
  auVar15._0_8_ = 0x3f8000003f800000;
  auVar15._12_4_ = 0x3f800000;
  uVar1 = vmovlps_avx(auVar15);
  *(undefined8 *)&(__return_storage_ptr__->max_time_range).upper = uVar1;
  (__return_storage_ptr__->time_range).upper = 0.0;
  BVar2 = (this->super_Instance).super_Geometry.time_range;
  auVar18._8_8_ = 0;
  auVar18._0_4_ = BVar2.lower;
  auVar18._4_4_ = BVar2.upper;
  auVar15 = vmovshdup_avx(auVar18);
  geom_time_segments = (this->super_Instance).super_Geometry.fnumTimeSegments;
  fVar17 = BVar2.lower;
  fVar9 = auVar15._0_4_ - fVar17;
  auVar15 = ZEXT416((uint)(geom_time_segments * ((t0t1->lower - fVar17) / fVar9) * 1.0000002));
  auVar15 = vroundss_avx(auVar15,auVar15,9);
  auVar15 = vmaxss_avx(ZEXT816(0) << 0x40,auVar15);
  auVar18 = ZEXT416((uint)(geom_time_segments * ((t0t1->upper - fVar17) / fVar9) * 0.99999976));
  auVar18 = vroundss_avx(auVar18,auVar18,10);
  auVar18 = vminss_avx(auVar18,ZEXT416((uint)geom_time_segments));
  uVar11 = 1;
  if ((uint)(int)auVar15._0_4_ <= (uint)(int)auVar18._0_4_) {
    uVar14 = (ulong)(int)auVar15._0_4_;
    lVar3 = *(long *)&(this->super_Instance).super_Geometry.field_0x58;
    pAVar12 = (this->super_Instance).local2world + uVar14;
    do {
      if ((this->super_Instance).super_Geometry.field_8.field_0x1 == '\x01') {
        fVar25 = (pAVar12->p).field_0.m128[3];
        fVar59 = (pAVar12->l).vx.field_0.m128[3];
        fVar62 = (pAVar12->l).vy.field_0.m128[3];
        fVar29 = (pAVar12->l).vz.field_0.m128[3];
        fVar32 = fVar59 * fVar62 + fVar29 * fVar25;
        fVar35 = fVar59 * fVar62 - fVar29 * fVar25;
        fVar39 = fVar25 * fVar25 - fVar59 * fVar59;
        fVar41 = fVar59 * fVar29 - fVar25 * fVar62;
        fVar33 = fVar25 * fVar62 + fVar59 * fVar29;
        fVar34 = fVar59 * fVar25 + fVar29 * fVar62;
        fVar43 = fVar29 * fVar62 - fVar59 * fVar25;
        auVar15 = ZEXT416((uint)(fVar32 + fVar32));
        auVar15 = vshufps_avx(auVar15,auVar15,0);
        auVar16 = ZEXT416((uint)(fVar41 + fVar41));
        auVar16 = vshufps_avx(auVar16,auVar16,0);
        auVar31 = vpermilps_avx(ZEXT416((uint)(-fVar29 * fVar29 +
                                              -fVar62 * fVar62 + fVar25 * fVar25 + fVar59 * fVar59))
                                ,0);
        fVar64 = auVar31._0_4_ * 1.0 + auVar15._0_4_ * 0.0 + auVar16._0_4_ * 0.0;
        fVar50 = auVar31._4_4_ * 0.0 + auVar15._4_4_ * 1.0 + auVar16._4_4_ * 0.0;
        fVar51 = auVar31._8_4_ * 0.0 + auVar15._8_4_ * 0.0 + auVar16._8_4_ * 1.0;
        fVar52 = auVar31._12_4_ * 0.0 + auVar15._12_4_ * 0.0 + auVar16._12_4_ * 0.0;
        auVar15 = ZEXT416((uint)(fVar35 + fVar35));
        auVar15 = vshufps_avx(auVar15,auVar15,0);
        auVar16 = ZEXT416((uint)(-fVar29 * fVar29 + fVar62 * fVar62 + fVar39));
        auVar16 = vshufps_avx(auVar16,auVar16,0);
        auVar31 = ZEXT416((uint)(fVar34 + fVar34));
        auVar31 = vshufps_avx(auVar31,auVar31,0);
        fVar53 = auVar15._0_4_ * 1.0 + auVar31._0_4_ * 0.0 + auVar16._0_4_ * 0.0;
        fVar54 = auVar15._4_4_ * 0.0 + auVar31._4_4_ * 0.0 + auVar16._4_4_ * 1.0;
        fVar56 = auVar15._8_4_ * 0.0 + auVar31._8_4_ * 1.0 + auVar16._8_4_ * 0.0;
        fVar57 = auVar15._12_4_ * 0.0 + auVar31._12_4_ * 0.0 + auVar16._12_4_ * 0.0;
        auVar15 = ZEXT416((uint)(fVar33 + fVar33));
        auVar15 = vshufps_avx(auVar15,auVar15,0);
        auVar31 = vpermilps_avx(ZEXT416((uint)(fVar43 + fVar43)),0);
        auVar16 = ZEXT416((uint)(fVar29 * fVar29 + -fVar62 * fVar62 + fVar39));
        auVar16 = vshufps_avx(auVar16,auVar16,0);
        fVar20 = auVar31._0_4_ * 0.0 + auVar16._0_4_ * 0.0 + auVar15._0_4_ * 1.0;
        fVar23 = auVar31._4_4_ * 1.0 + auVar16._4_4_ * 0.0 + auVar15._4_4_ * 0.0;
        fVar24 = auVar31._8_4_ * 0.0 + auVar16._8_4_ * 1.0 + auVar15._8_4_ * 0.0;
        fVar63 = auVar31._12_4_ * 0.0 + auVar16._12_4_ * 0.0 + auVar15._12_4_ * 0.0;
        fVar25 = (pAVar12->l).vx.field_0.m128[0];
        fVar36 = fVar53 * 0.0 + fVar20 * 0.0 + fVar64 * fVar25;
        fVar40 = fVar54 * 0.0 + fVar23 * 0.0 + fVar50 * fVar25;
        fVar42 = fVar56 * 0.0 + fVar24 * 0.0 + fVar51 * fVar25;
        fVar44 = fVar57 * 0.0 + fVar63 * 0.0 + fVar52 * fVar25;
        fVar25 = (pAVar12->l).vy.field_0.m128[0];
        fVar59 = (pAVar12->l).vy.field_0.m128[1];
        fVar35 = fVar25 * fVar64 + fVar20 * 0.0 + fVar53 * fVar59;
        fVar39 = fVar25 * fVar50 + fVar23 * 0.0 + fVar54 * fVar59;
        fVar41 = fVar25 * fVar51 + fVar24 * 0.0 + fVar56 * fVar59;
        fVar43 = fVar25 * fVar52 + fVar63 * 0.0 + fVar57 * fVar59;
        fVar25 = (pAVar12->l).vz.field_0.m128[1];
        fVar59 = (pAVar12->l).vz.field_0.m128[2];
        fVar62 = (pAVar12->l).vz.field_0.m128[0];
        fVar29 = fVar59 * fVar20 + fVar25 * fVar53 + fVar64 * fVar62;
        fVar32 = fVar59 * fVar23 + fVar25 * fVar54 + fVar50 * fVar62;
        fVar33 = fVar59 * fVar24 + fVar25 * fVar56 + fVar51 * fVar62;
        fVar34 = fVar59 * fVar63 + fVar25 * fVar57 + fVar52 * fVar62;
        fVar25 = (pAVar12->p).field_0.m128[2];
        fVar59 = (pAVar12->p).field_0.m128[1];
        fVar62 = (pAVar12->p).field_0.m128[0];
        auVar15 = vshufps_avx((undefined1  [16])(pAVar12->l).vx.field_0,ZEXT816(0) << 0x20,0xe9);
        auVar15 = vblendps_avx(auVar15,(undefined1  [16])(pAVar12->l).vy.field_0,4);
        fVar20 = auVar15._0_4_ + 0.0 + fVar62 * fVar64 + fVar59 * fVar53 + fVar25 * fVar20;
        fVar23 = auVar15._4_4_ + 0.0 + fVar62 * fVar50 + fVar59 * fVar54 + fVar25 * fVar23;
        fVar24 = auVar15._8_4_ + 0.0 + fVar62 * fVar51 + fVar59 * fVar56 + fVar25 * fVar24;
        fVar25 = auVar15._12_4_ + 0.0 + fVar62 * fVar52 + fVar59 * fVar57 + fVar25 * fVar63;
      }
      else {
        fVar36 = (pAVar12->l).vx.field_0.m128[0];
        fVar40 = (pAVar12->l).vx.field_0.m128[1];
        fVar42 = (pAVar12->l).vx.field_0.m128[2];
        fVar44 = (pAVar12->l).vx.field_0.m128[3];
        fVar35 = (pAVar12->l).vy.field_0.m128[0];
        fVar39 = (pAVar12->l).vy.field_0.m128[1];
        fVar41 = (pAVar12->l).vy.field_0.m128[2];
        fVar43 = (pAVar12->l).vy.field_0.m128[3];
        fVar29 = (pAVar12->l).vz.field_0.m128[0];
        fVar32 = (pAVar12->l).vz.field_0.m128[1];
        fVar33 = (pAVar12->l).vz.field_0.m128[2];
        fVar34 = (pAVar12->l).vz.field_0.m128[3];
        fVar20 = (pAVar12->p).field_0.m128[0];
        fVar23 = (pAVar12->p).field_0.m128[1];
        fVar24 = (pAVar12->p).field_0.m128[2];
        fVar25 = (pAVar12->p).field_0.m128[3];
      }
      fVar59 = ((float)(int)uVar14 * fVar9) / geom_time_segments + fVar17;
      auVar15 = vshufps_avx(ZEXT416((uint)fVar59),ZEXT416((uint)fVar59),0);
      local_98 = (float)*(undefined8 *)(lVar3 + 0x30);
      fStack_94 = (float)((ulong)*(undefined8 *)(lVar3 + 0x30) >> 0x20);
      fStack_90 = (float)*(undefined8 *)(lVar3 + 0x38);
      fStack_8c = (float)((ulong)*(undefined8 *)(lVar3 + 0x38) >> 0x20);
      auVar16 = vshufps_avx(ZEXT416((uint)(1.0 - fVar59)),ZEXT416((uint)(1.0 - fVar59)),0);
      local_c8 = (float)*(undefined8 *)(lVar3 + 0x10);
      fStack_c4 = (float)((ulong)*(undefined8 *)(lVar3 + 0x10) >> 0x20);
      fStack_c0 = (float)*(undefined8 *)(lVar3 + 0x18);
      fStack_bc = (float)((ulong)*(undefined8 *)(lVar3 + 0x18) >> 0x20);
      auVar55._0_4_ = auVar15._0_4_ * local_98 + auVar16._0_4_ * local_c8;
      auVar55._4_4_ = auVar15._4_4_ * fStack_94 + auVar16._4_4_ * fStack_c4;
      auVar55._8_4_ = auVar15._8_4_ * fStack_90 + auVar16._8_4_ * fStack_c0;
      auVar55._12_4_ = auVar15._12_4_ * fStack_8c + auVar16._12_4_ * fStack_bc;
      local_a8 = (float)*(undefined8 *)(lVar3 + 0x40);
      fStack_a4 = (float)((ulong)*(undefined8 *)(lVar3 + 0x40) >> 0x20);
      fStack_a0 = (float)*(undefined8 *)(lVar3 + 0x48);
      fStack_9c = (float)((ulong)*(undefined8 *)(lVar3 + 0x48) >> 0x20);
      local_88 = (float)*(undefined8 *)(lVar3 + 0x20);
      fStack_84 = (float)((ulong)*(undefined8 *)(lVar3 + 0x20) >> 0x20);
      fStack_80 = (float)*(undefined8 *)(lVar3 + 0x28);
      fStack_7c = (float)((ulong)*(undefined8 *)(lVar3 + 0x28) >> 0x20);
      auVar48._0_4_ = auVar15._0_4_ * local_a8 + auVar16._0_4_ * local_88;
      auVar48._4_4_ = auVar15._4_4_ * fStack_a4 + auVar16._4_4_ * fStack_84;
      auVar48._8_4_ = auVar15._8_4_ * fStack_a0 + auVar16._8_4_ * fStack_80;
      auVar48._12_4_ = auVar15._12_4_ * fStack_9c + auVar16._12_4_ * fStack_7c;
      auVar15 = vshufps_avx(auVar55,auVar55,0);
      auVar16 = vshufps_avx(auVar55,auVar55,0x55);
      auVar31 = vshufps_avx(auVar55,auVar55,0xaa);
      fVar54 = fVar20 + auVar31._0_4_ * fVar29;
      fVar56 = fVar23 + auVar31._4_4_ * fVar32;
      fVar57 = fVar24 + auVar31._8_4_ * fVar33;
      fVar58 = fVar25 + auVar31._12_4_ * fVar34;
      fVar59 = fVar35 * auVar16._0_4_;
      fVar62 = fVar39 * auVar16._4_4_;
      fVar63 = fVar41 * auVar16._8_4_;
      fVar64 = fVar43 * auVar16._12_4_;
      fVar65 = fVar59 + fVar54;
      fVar66 = fVar62 + fVar56;
      fVar67 = fVar63 + fVar57;
      fVar68 = fVar64 + fVar58;
      fVar50 = fVar36 * auVar15._0_4_;
      fVar51 = fVar40 * auVar15._4_4_;
      fVar52 = fVar42 * auVar15._8_4_;
      fVar53 = fVar44 * auVar15._12_4_;
      auVar19._0_4_ = fVar50 + fVar65;
      auVar19._4_4_ = fVar51 + fVar66;
      auVar19._8_4_ = fVar52 + fVar67;
      auVar19._12_4_ = fVar53 + fVar68;
      auVar31 = vshufps_avx(auVar48,auVar48,0xaa);
      auVar16 = vminps_avx((undefined1  [16])aVar30,auVar19);
      auVar15 = vmaxps_avx((undefined1  [16])aVar27,auVar19);
      fVar20 = fVar20 + fVar29 * auVar31._0_4_;
      fVar23 = fVar23 + fVar32 * auVar31._4_4_;
      fVar24 = fVar24 + fVar33 * auVar31._8_4_;
      fVar25 = fVar25 + fVar34 * auVar31._12_4_;
      fVar59 = fVar59 + fVar20;
      fVar62 = fVar62 + fVar23;
      fVar63 = fVar63 + fVar24;
      fVar64 = fVar64 + fVar25;
      auVar60._0_4_ = fVar50 + fVar59;
      auVar60._4_4_ = fVar51 + fVar62;
      auVar60._8_4_ = fVar52 + fVar63;
      auVar60._12_4_ = fVar53 + fVar64;
      auVar16 = vminps_avx(auVar16,auVar60);
      auVar15 = vmaxps_avx(auVar15,auVar60);
      auVar31 = vshufps_avx(auVar48,auVar48,0x55);
      fVar35 = fVar35 * auVar31._0_4_;
      fVar39 = fVar39 * auVar31._4_4_;
      fVar41 = fVar41 * auVar31._8_4_;
      fVar43 = fVar43 * auVar31._12_4_;
      fVar54 = fVar35 + fVar54;
      fVar56 = fVar39 + fVar56;
      fVar57 = fVar41 + fVar57;
      fVar58 = fVar43 + fVar58;
      auVar61._0_4_ = fVar50 + fVar54;
      auVar61._4_4_ = fVar51 + fVar56;
      auVar61._8_4_ = fVar52 + fVar57;
      auVar61._12_4_ = fVar53 + fVar58;
      auVar16 = vminps_avx(auVar16,auVar61);
      auVar15 = vmaxps_avx(auVar15,auVar61);
      fVar35 = fVar35 + fVar20;
      fVar39 = fVar39 + fVar23;
      fVar41 = fVar41 + fVar24;
      fVar43 = fVar43 + fVar25;
      auVar37._0_4_ = fVar50 + fVar35;
      auVar37._4_4_ = fVar51 + fVar39;
      auVar37._8_4_ = fVar52 + fVar41;
      auVar37._12_4_ = fVar53 + fVar43;
      auVar16 = vminps_avx(auVar16,auVar37);
      auVar15 = vmaxps_avx(auVar15,auVar37);
      auVar31 = vshufps_avx(auVar48,auVar48,0);
      fVar36 = fVar36 * auVar31._0_4_;
      fVar40 = fVar40 * auVar31._4_4_;
      fVar42 = fVar42 * auVar31._8_4_;
      fVar44 = fVar44 * auVar31._12_4_;
      auVar49._0_4_ = fVar36 + fVar65;
      auVar49._4_4_ = fVar40 + fVar66;
      auVar49._8_4_ = fVar42 + fVar67;
      auVar49._12_4_ = fVar44 + fVar68;
      auVar16 = vminps_avx(auVar16,auVar49);
      auVar15 = vmaxps_avx(auVar15,auVar49);
      auVar45._0_4_ = fVar36 + fVar59;
      auVar45._4_4_ = fVar40 + fVar62;
      auVar45._8_4_ = fVar42 + fVar63;
      auVar45._12_4_ = fVar44 + fVar64;
      auVar16 = vminps_avx(auVar16,auVar45);
      auVar15 = vmaxps_avx(auVar15,auVar45);
      auVar46._0_4_ = fVar36 + fVar54;
      auVar46._4_4_ = fVar40 + fVar56;
      auVar46._8_4_ = fVar42 + fVar57;
      auVar46._12_4_ = fVar44 + fVar58;
      auVar16 = vminps_avx(auVar16,auVar46);
      auVar15 = vmaxps_avx(auVar15,auVar46);
      auVar21._0_4_ = fVar36 + fVar35;
      auVar21._4_4_ = fVar40 + fVar39;
      auVar21._8_4_ = fVar42 + fVar41;
      auVar21._12_4_ = fVar44 + fVar43;
      auVar31 = vminps_avx(auVar16,auVar21);
      auVar16 = vmaxps_avx(auVar15,auVar21);
      auVar22._8_4_ = 0xddccb9a2;
      auVar22._0_8_ = 0xddccb9a2ddccb9a2;
      auVar22._12_4_ = 0xddccb9a2;
      auVar15 = vcmpps_avx(auVar31,auVar22,6);
      auVar31._8_4_ = 0x5dccb9a2;
      auVar31._0_8_ = 0x5dccb9a25dccb9a2;
      auVar31._12_4_ = 0x5dccb9a2;
      auVar16 = vcmpps_avx(auVar16,auVar31,1);
      auVar15 = vandps_avx(auVar16,auVar15);
      uVar13 = vmovmskps_avx(auVar15);
      if ((~(byte)uVar13 & 7) != 0) {
        return __return_storage_ptr__;
      }
      uVar14 = uVar14 + 1;
      pAVar12 = pAVar12 + 1;
    } while (uVar14 <= (ulong)(long)(int)auVar18._0_4_);
    uVar11 = (__return_storage_ptr__->object_range)._end + 1;
  }
  Instance::nonlinearBounds
            ((LBBox3fa *)&local_78.field_1,&this->super_Instance,t0t1,
             &(this->super_Instance).super_Geometry.time_range,geom_time_segments);
  BVar2 = (this->super_Instance).super_Geometry.time_range;
  auVar16._8_8_ = 0;
  auVar16._0_4_ = BVar2.lower;
  auVar16._4_4_ = BVar2.upper;
  aVar6 = (anon_struct_16_4_dc41325d_for_anon_union_16_2_47237d3f_for_Vec3fx_0_1)
          vinsertps_avx((undefined1  [16])local_78,ZEXT416(geomID),0x30);
  aVar5 = (anon_struct_16_4_dc41325d_for_anon_union_16_2_47237d3f_for_Vec3fx_0_1)
          vblendps_avx(ZEXT816(0) << 0x40,local_68,7);
  uVar10 = (this->super_Instance).super_Geometry.numTimeSteps - 1;
  aVar7 = (anon_struct_16_4_dc41325d_for_anon_union_16_2_47237d3f_for_Vec3fx_0_1)
          vinsertps_avx(local_58,ZEXT416(uVar10),0x30);
  aVar8 = (anon_struct_16_4_dc41325d_for_anon_union_16_2_47237d3f_for_Vec3fx_0_1)
          vinsertps_avx(local_48,ZEXT416(uVar10),0x30);
  auVar28._0_4_ = aVar6.x * 0.5 + aVar7.x * 0.5 + aVar8.x * 0.5 + aVar5.x * 0.5;
  auVar28._4_4_ = aVar6.y * 0.5 + aVar7.y * 0.5 + aVar8.y * 0.5 + aVar5.y * 0.5;
  auVar28._8_4_ = aVar6.z * 0.5 + aVar7.z * 0.5 + aVar8.z * 0.5 + aVar5.z * 0.5;
  auVar28._12_4_ =
       aVar6.field_3.w * 0.5 + aVar7.field_3.w * 0.5 + aVar8.field_3.w * 0.5 + aVar5.field_3.w * 0.5
  ;
  auVar47._8_4_ = 0x7f800000;
  auVar47._0_8_ = 0x7f8000007f800000;
  auVar47._12_4_ = 0x7f800000;
  aVar27 = (anon_union_16_2_47237d3f_for_Vec3fa_0)vminps_avx(auVar47,(undefined1  [16])aVar6);
  (__return_storage_ptr__->super_CentGeom<embree::LBBox<embree::Vec3fa>_>).geomBounds.bounds0.lower.
  field_0 = aVar27;
  auVar38._8_4_ = 0xff800000;
  auVar38._0_8_ = 0xff800000ff800000;
  auVar38._12_4_ = 0xff800000;
  aVar27 = (anon_union_16_2_47237d3f_for_Vec3fa_0)vmaxps_avx(auVar38,(undefined1  [16])aVar5);
  (__return_storage_ptr__->super_CentGeom<embree::LBBox<embree::Vec3fa>_>).geomBounds.bounds0.upper.
  field_0 = aVar27;
  aVar27 = (anon_union_16_2_47237d3f_for_Vec3fa_0)vminps_avx(auVar47,(undefined1  [16])aVar7);
  (__return_storage_ptr__->super_CentGeom<embree::LBBox<embree::Vec3fa>_>).geomBounds.bounds1.lower.
  field_0 = aVar27;
  aVar27 = (anon_union_16_2_47237d3f_for_Vec3fa_0)vmaxps_avx(auVar38,(undefined1  [16])aVar8);
  (__return_storage_ptr__->super_CentGeom<embree::LBBox<embree::Vec3fa>_>).geomBounds.bounds1.upper.
  field_0 = aVar27;
  aVar27 = (anon_union_16_2_47237d3f_for_Vec3fa_0)vminps_avx(auVar47,auVar28);
  (__return_storage_ptr__->super_CentGeom<embree::LBBox<embree::Vec3fa>_>).centBounds.lower.field_0
       = aVar27;
  aVar27 = (anon_union_16_2_47237d3f_for_Vec3fa_0)vmaxps_avx(auVar38,auVar28);
  auVar15 = vcmpps_avx(SUB6416(ZEXT464(0x3f800000),0),auVar16,1);
  auVar18 = vinsertps_avx(SUB6416(ZEXT464(0x3f800000),0),auVar16,0x5c);
  auVar26._4_12_ = ZEXT812(0) << 0x20;
  auVar26._0_4_ = BVar2.lower;
  auVar15 = vblendvps_avx(auVar26,auVar18,auVar15);
  (__return_storage_ptr__->super_CentGeom<embree::LBBox<embree::Vec3fa>_>).centBounds.upper.field_0
       = aVar27;
  BVar2 = (BBox1f)vmovlps_avx(auVar15);
  __return_storage_ptr__->time_range = BVar2;
  (__return_storage_ptr__->object_range)._end = uVar11;
  __return_storage_ptr__->num_time_segments = (ulong)uVar10;
  if (uVar10 != 0) {
    __return_storage_ptr__->max_num_time_segments = (ulong)uVar10;
    BVar2 = (BBox1f)vmovlps_avx(auVar16);
    __return_storage_ptr__->max_time_range = BVar2;
  }
  pPVar4 = prims->items;
  pPVar4[k].lbounds.bounds0.lower.field_0.field_1 = aVar6;
  pPVar4[k].lbounds.bounds0.upper.field_0.field_1 = aVar5;
  pPVar4[k].lbounds.bounds1.lower.field_0.field_1 = aVar7;
  pPVar4[k].lbounds.bounds1.upper.field_0.field_1 = aVar8;
  BVar2 = (BBox1f)vmovlps_avx(auVar16);
  pPVar4[k].time_range = BVar2;
  return __return_storage_ptr__;
}

Assistant:

PrimInfoMB createPrimRefMBArray(mvector<PrimRefMB>& prims, const BBox1f& t0t1, const range<size_t>& r, size_t k, unsigned int geomID) const
      {
        assert(r.begin() == 0);
        assert(r.end()   == 1);

        PrimInfoMB pinfo(empty);
        if (!valid(0, timeSegmentRange(t0t1))) return pinfo;
        const PrimRefMB prim(linearBounds(0,t0t1),this->numTimeSegments(),this->time_range,this->numTimeSegments(),geomID,unsigned(0));
        pinfo.add_primref(prim);
        prims[k++] = prim;
        return pinfo;
      }